

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_assertion_handler.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::handleExpr<slang::logic_t&>
          (AssertionHandler *this,ExprLhs<slang::logic_t_&> *expr)

{
  uint8_t uVar1;
  ITransientExpression local_18;
  logic_t *local_8;
  
  local_8 = expr->m_lhs;
  uVar1 = local_8->value;
  local_18.m_result = (uVar1 != '\0' && uVar1 != '@') && uVar1 != 0x80;
  local_18.m_isBinaryExpression = false;
  local_18._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb7468;
  handleExpr(this,&local_18);
  return;
}

Assistant:

constexpr void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }